

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<QMap<QString,_QVariant>_>::relocate
          (QArrayDataPointer<QMap<QString,_QVariant>_> *this,qsizetype offset,
          QMap<QString,_QVariant> **data)

{
  QMap<QString,_QVariant> *d_first;
  QMap<QString,_QVariant> *pQVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QMap<QString,QVariant>,long_long>(this->ptr,this->size,d_first);
  if (data != (QMap<QString,_QVariant> **)0x0) {
    pQVar1 = *data;
    if ((this->ptr <= pQVar1) && (pQVar1 < this->ptr + this->size)) {
      *data = pQVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }